

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

int STRING_concat(STRING_HANDLE handle,char *s2)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  long lVar6;
  size_t __size;
  STRING *s1;
  
  iVar5 = 0x196;
  if (s2 != (char *)0x0 && handle != (STRING_HANDLE)0x0) {
    pcVar3 = handle->s;
    sVar1 = strlen(pcVar3);
    sVar2 = strlen(s2);
    lVar6 = sVar2 + sVar1;
    if (CARRY8(sVar2,sVar1)) {
      lVar6 = -1;
    }
    __size = lVar6 + 1;
    if (__size == 0) {
      __size = 0xffffffffffffffff;
    }
    if ((__size != 0xffffffffffffffff) &&
       (pcVar3 = (char *)realloc(pcVar3,__size), pcVar3 != (char *)0x0)) {
      handle->s = pcVar3;
      memcpy(pcVar3 + sVar1,s2,sVar2 + 1);
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar5 = 0x1a4;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/strings.c"
                ,"STRING_concat",0x1a3,1,"Failure reallocating value. size=%zu",__size);
    }
  }
  return iVar5;
}

Assistant:

int STRING_concat(STRING_HANDLE handle, const char* s2)
{
    int result;
    if ((handle == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_013: [STRING_concat shall return a nonzero number if an error is encountered.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        size_t s1Length = strlen(s1->s);
        size_t s2Length = strlen(s2);
        size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, s2Length), 1);
        char* temp;
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
        {
            /* Codes_SRS_STRING_07_013: [STRING_concat shall return a nonzero number if an error is encountered.] */
            LogError("Failure reallocating value. size=%zu", realloc_size);
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            (void)memcpy(s1->s + s1Length, s2, s2Length + 1);
            result = 0;
        }
    }
    return result;
}